

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O1

void __thiscall MathOp::Sigmoid_Mat::forward(Sigmoid_Mat *this)

{
  int *piVar1;
  bool bVar2;
  Mat *pMVar3;
  Div2mP *this_00;
  undefined1 in_stack_ffffffffffffff08 [16];
  Mat local_c8;
  Mat local_a0;
  Mat local_78;
  Mat local_50;
  undefined8 local_28;
  undefined8 local_20;
  
  Op::reinit(&this->super_Op);
  switch((this->super_Op).forwardRound) {
  case 1:
    pMVar3 = NeuronMat::getForward(this->a);
    local_c8.order = 0;
    local_c8._12_4_ = 0;
    local_c8.r = 0x80000;
    local_c8.c = 0;
    Mat::operator+((Mat *)&stack0xffffffffffffff10,pMVar3,(ll128 *)&local_c8);
    Mat::operator=(this->u_st,(Mat *)&stack0xffffffffffffff10);
    Mat::~Mat((Mat *)&stack0xffffffffffffff10);
    pMVar3 = NeuronMat::getForward(this->a);
    Mat::operator-((Mat *)&stack0xffffffffffffff10,pMVar3,(ll128)in_stack_ffffffffffffff08);
    Mat::operator=(this->u_nd,(Mat *)&stack0xffffffffffffff10);
    pMVar3 = (Mat *)&stack0xffffffffffffff10;
    goto LAB_001163c4;
  case 2:
    (**(this->pLTZ_f_1->super_Op)._vptr_Op)();
    this_00 = (Div2mP *)this->pLTZ_f_1;
    break;
  case 3:
    (**(this->pLTZ_f_2->super_Op)._vptr_Op)();
    this_00 = (Div2mP *)this->pLTZ_f_2;
    break;
  case 4:
    Mat::oneMinus_IE((Mat *)&stack0xffffffffffffff10,this->u_st_res);
    Mat::operator=(this->u_st,(Mat *)&stack0xffffffffffffff10);
    Mat::~Mat((Mat *)&stack0xffffffffffffff10);
    Mat::oneMinus_IE((Mat *)&stack0xffffffffffffff10,this->u_nd_res);
    Mat::operator=(this->u_nd,(Mat *)&stack0xffffffffffffff10);
    Mat::~Mat((Mat *)&stack0xffffffffffffff10);
    pMVar3 = NeuronMat::getForward(this->a);
    local_20 = 0;
    local_28 = 0x80000;
    Mat::operator+(&local_50,pMVar3,(ll128 *)&local_28);
    Mat::dot(&local_c8,&local_50,this->u_st);
    pMVar3 = NeuronMat::getForward(this->a);
    Mat::operator-(&local_a0,pMVar3,(ll128)in_stack_ffffffffffffff08);
    Mat::dot(&local_78,&local_a0,this->u_nd);
    Mat::operator-((Mat *)&stack0xffffffffffffff10,&local_c8,&local_78);
    pMVar3 = NeuronMat::getForward(this->res);
    Mat::operator=(pMVar3,(Mat *)&stack0xffffffffffffff10);
    Mat::~Mat((Mat *)&stack0xffffffffffffff10);
    Mat::~Mat(&local_78);
    Mat::~Mat(&local_a0);
    Mat::~Mat(&local_c8);
    pMVar3 = &local_50;
LAB_001163c4:
    Mat::~Mat(pMVar3);
    return;
  case 5:
    (**(this->pDegRed_res->super_Op)._vptr_Op)();
    this_00 = this->pDegRed_res;
    break;
  default:
    goto switchD_00116200_default;
  }
  bVar2 = Op::forwardHasNext(&this_00->super_Op);
  if (bVar2) {
    piVar1 = &(this->super_Op).forwardRound;
    *piVar1 = *piVar1 + -1;
  }
switchD_00116200_default:
  return;
}

Assistant:

void MathOp::Sigmoid_Mat::forward() {
    reinit();
    switch (forwardRound) {
        case 1:
            *u_st = *a->getForward() + (IE >> 1);
            *u_nd = *a->getForward() - (IE >> 1);
            break;
        case 2:
//            u_st->print();
            pLTZ_f_1->forward();
//            u_st->print();
            if (pLTZ_f_1->forwardHasNext()) {
                forwardRound--;
            }
            break;
        case 3:
            pLTZ_f_2->forward();
            if (pLTZ_f_2->forwardHasNext()) {
                forwardRound--;
            }
            break;
        case 4:
            // added by curious 2020.6.4 -1 --> -IE
            *u_st = u_st_res->oneMinus_IE();
            *u_nd = u_nd_res->oneMinus_IE();
            *res->getForward() = (*a->getForward() + (IE >> 1)).dot(*u_st) - (*a->getForward() - (IE >> 1)).dot(*u_nd);
//            *res->getAux() = a->getForward()->dot(a->getForward()->oneMinus_IE());
            break;
        case 5:
            pDegRed_res->forward();
//            pDiv2mP_aux->forward();
            if (pDegRed_res->forwardHasNext()) {
                forwardRound--;
            }
            break;
        // case 5:
        //     reveal->forward();
        //     if (reveal->forwardHasNext()) {
        //         forwardRound--;
        //     }
        //     break;
        // case 6:
        //     cout << "tmp\n";
        //     tmp->print();
        //     break;
    }
}